

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree_iterators.h
# Opt level: O0

void __thiscall
Gudhi::
Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>
::Simplex_tree_complex_simplex_iterator
          (Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>
           *this,Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *st)

{
  Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *this_00;
  bool bVar1;
  Siblings *pSVar2;
  Dictionary *this_01;
  pointer ppVar3;
  Siblings *pSVar4;
  undefined1 local_30 [24];
  Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *local_18;
  Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *st_local;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>
  *this_local;
  
  local_18 = st;
  st_local = (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *)this;
  boost::container::
  vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
  ::vec_iterator(&this->sh_);
  this->sib_ = (Siblings *)0x0;
  this->st_ = local_18;
  if ((local_18 !=
       (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *)0x0) &&
     (pSVar2 = Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>::root
                         (local_18), pSVar2 != (Siblings *)0x0)) {
    pSVar2 = Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>::root
                       (local_18);
    this_01 = Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_std::less<short>,_void>_>
              ::members(pSVar2);
    bVar1 = boost::container::
            flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_std::less<short>,_void>
            ::empty(this_01);
    if (!bVar1) {
      pSVar2 = Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>::root
                         (local_18);
      Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_std::less<short>,_void>_>
      ::members(pSVar2);
      boost::container::
      flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_std::less<short>,_void>
      ::begin((flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_std::less<short>,_void>
               *)(local_30 + 0x10));
      boost::container::
      vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
      ::operator=(&this->sh_,
                  (vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                   *)(local_30 + 0x10));
      pSVar2 = Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>::root
                         (local_18);
      this->sib_ = pSVar2;
      while( true ) {
        this_00 = local_18;
        boost::container::
        vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
        ::vec_iterator((vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                        *)(local_30 + 8),&this->sh_);
        bVar1 = Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>::
                has_children<boost::container::vec_iterator<std::pair<short,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>>>*,true>>
                          (this_00,(vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                                    *)(local_30 + 8));
        if (!bVar1) break;
        ppVar3 = boost::container::
                 vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                 ::operator->(&this->sh_);
        pSVar4 = Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>
                 ::children(&ppVar3->second);
        this->sib_ = pSVar4;
        Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_std::less<short>,_void>_>
        ::members(this->sib_);
        boost::container::
        flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_std::less<short>,_void>
        ::begin((flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_std::less<short>,_void>
                 *)local_30);
        boost::container::
        vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
        ::operator=(&this->sh_,
                    (vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>_*,_true>
                     *)local_30);
      }
      return;
    }
  }
  this->st_ = (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *)0x0;
  return;
}

Assistant:

explicit Simplex_tree_complex_simplex_iterator(SimplexTree const* st)
      : sib_(nullptr),
        st_(st) {
    if (st == nullptr || st->root() == nullptr || st->root()->members().empty()) {
      st_ = nullptr;
    } else {
      sh_ = st->root()->members().begin();
      sib_ = st->root();
      while (st->has_children(sh_)) {
        sib_ = sh_->second.children();
        sh_ = sib_->members().begin();
      }
    }
  }